

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O0

void Shell::Shuffling::
     shuffleArray<Lib::DArray<std::pair<Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*>>>
               (DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> *a,
               uint len)

{
  int iVar1;
  uint in_ESI;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> *in_RDI;
  uint j;
  uint i;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *in_stack_ffffffffffffffd8;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *in_stack_ffffffffffffffe0;
  undefined4 local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    iVar1 = Lib::Random::getInteger((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    in_stack_ffffffffffffffe0 =
         Lib::DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>::
         operator[](in_RDI,(ulong)local_10);
    Lib::DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>::operator[]
              (in_RDI,(ulong)(iVar1 + local_10));
    std::swap<Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void shuffleArray(Arrayish& a, unsigned len) {
    for(unsigned i=0;i<len;i++){
      unsigned j = Random::getInteger(len-i)+i;
      std::swap(a[i],a[j]);
    }
  }